

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FullSegment.hpp
# Opt level: O0

void __thiscall cppjieba::FullSegment::FullSegment(FullSegment *this,string *dictPath)

{
  void *pvVar1;
  undefined8 *in_RDI;
  SegmentBase *in_stack_00000180;
  allocator local_41;
  string local_40 [12];
  UserWordWeightOption in_stack_ffffffffffffffcc;
  string *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  DictTrie *in_stack_ffffffffffffffe0;
  
  SegmentBase::SegmentBase(in_stack_00000180);
  *in_RDI = &PTR__FullSegment_001f83f0;
  pvVar1 = operator_new(0xd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",&local_41);
  DictTrie::DictTrie(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                     in_stack_ffffffffffffffcc);
  in_RDI[8] = pvVar1;
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  *(undefined1 *)(in_RDI + 9) = 1;
  return;
}

Assistant:

FullSegment(const string& dictPath) {
    dictTrie_ = new DictTrie(dictPath);
    isNeedDestroy_ = true;
  }